

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeIterator.hpp
# Opt level: O3

void __thiscall
ft::
map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::erase(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,iterator *first,iterator *last)

{
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar1;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar2;
  treeNode<ft::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptVar3;
  bool bVar4;
  iterator local_48;
  
  local_48.m_node = first->m_node;
  if (local_48.m_node != last->m_node) {
    do {
      local_48.m_tree = first->m_tree;
      ptVar1 = (local_48.m_node)->right;
      ptVar3 = local_48.m_node;
      if ((local_48.m_node)->right == (local_48.m_tree)->NIL) {
        do {
          ptVar2 = ptVar3->parent;
          bVar4 = ptVar2->right == ptVar3;
          ptVar3 = ptVar2;
        } while (bVar4);
      }
      else {
        do {
          ptVar2 = ptVar1;
          ptVar1 = ptVar2->left;
        } while (ptVar2->left != (local_48.m_tree)->NIL);
      }
      first->m_node = ptVar2;
      local_48._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113bc0;
      erase(this,&local_48);
      local_48.m_node = first->m_node;
    } while (local_48.m_node != last->m_node);
  }
  return;
}

Assistant:

treeNode<value_type>*	node() const { return this->m_node; }